

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O2

bool __thiscall
notch::core::IterationCallback::operator()
          (IterationCallback *this,int currentIteration,bool alwaysInvoke)

{
  bool bVar1;
  undefined7 in_register_00000011;
  
  if (((int)CONCAT71(in_register_00000011,alwaysInvoke) == 0) &&
     ((this->period < 1 || (currentIteration % this->period != 0)))) {
    return false;
  }
  bVar1 = std::function<bool_(int)>::operator()(&this->callback,currentIteration);
  return bVar1;
}

Assistant:

bool operator()(int currentIteration, bool alwaysInvoke = false) const {
        if (alwaysInvoke || (period > 0 && currentIteration % period == 0)) {
            return callback(currentIteration);
        } else {
            return false;
        }
    }